

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Vec_IntPermute(Vec_Int_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  time_t tVar5;
  int t;
  int j;
  int *pArray;
  int nSize;
  int i;
  Vec_Int_t *p_local;
  
  iVar2 = Vec_IntSize(p);
  piVar4 = Vec_IntArray(p);
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  for (pArray._4_4_ = 0; pArray._4_4_ < iVar2; pArray._4_4_ = pArray._4_4_ + 1) {
    iVar3 = rand();
    iVar1 = piVar4[pArray._4_4_];
    piVar4[pArray._4_4_] = piVar4[iVar3 % iVar2];
    piVar4[iVar3 % iVar2] = iVar1;
  }
  return;
}

Assistant:

void Vec_IntPermute( Vec_Int_t * p )
{
    int i, nSize = Vec_IntSize( p );
    int * pArray = Vec_IntArray( p );
    srand( time(NULL) );
    for ( i = 0; i < nSize; i++ )
    {
        int j = rand()%nSize;
        ABC_SWAP( int, pArray[i], pArray[j] );
    }
}